

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
                  *this,vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                        *list)

{
  pointer pDVar1;
  pointer data;
  DecodeRawTransactionTxOut object;
  DecodeRawTransactionTxOut DStack_128;
  
  pDVar1 = (list->
           super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pDVar1; data = data + 1) {
    api::json::DecodeRawTransactionTxOut::DecodeRawTransactionTxOut(&DStack_128);
    api::json::DecodeRawTransactionTxOut::ConvertFromStruct(&DStack_128,data);
    std::
    vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
    ::push_back(&(this->super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>).
                 super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
                ,&DStack_128);
    api::json::DecodeRawTransactionTxOut::~DecodeRawTransactionTxOut(&DStack_128);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }